

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::SubroutineFunction::SubroutineFunction
          (SubroutineFunction *this,UniformValueGenerator *generator,Index _index)

{
  UniformType local_b0;
  
  (this->index).super_LayoutSpecifierBase.val = (int)_index.super_LayoutSpecifierBase._0_8_;
  (this->index).super_LayoutSpecifierBase.numSys =
       (int)((ulong)_index.super_LayoutSpecifierBase._0_8_ >> 0x20);
  (this->index).super_LayoutSpecifierBase.occurence.occurence =
       _index.super_LayoutSpecifierBase.occurence.occurence.occurence;
  UniformType::UniformType(&local_b0,0x8b52,0);
  UniformValue::UniformValue(&this->embeddedRetVal,&local_b0,generator);
  UniformType::~UniformType(&local_b0);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

SubroutineFunction(UniformValueGenerator& generator, Index _index = Index::Implicit())
		: index(_index), embeddedRetVal(GL_FLOAT_VEC4, generator)
	{
	}